

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

string * __thiscall
google::protobuf::Reflection::GetStringReference
          (Reflection *this,Message *message,FieldDescriptor *field,string *scratch)

{
  bool bVar1;
  CppType CVar2;
  string *psVar3;
  ArenaStringPtr *pAVar4;
  
  if (*(Descriptor **)(field + 0x50) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetStringReference","Field does not match message type.");
  }
  if (*(int *)(field + 0x3c) == 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"GetStringReference",
               "Field is repeated; the method requires a singular field.");
  }
  CVar2 = FieldDescriptor::cpp_type(field);
  if (CVar2 != CPPTYPE_STRING) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"GetStringReference",CPPTYPE_STRING);
  }
  if (field[0x42] == (FieldDescriptor)0x1) {
    psVar3 = internal::ExtensionSet::GetString
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite +
                        (ulong)(uint)(this->schema_).extensions_offset_),*(int *)(field + 0x44),
                        *(string **)(field + 0x90));
    return psVar3;
  }
  bVar1 = internal::ReflectionSchema::IsFieldInlined(&this->schema_,field);
  if (bVar1) {
    psVar3 = (string *)GetRaw<google::protobuf::internal::InlinedStringField>(this,message,field);
    return psVar3;
  }
  pAVar4 = GetRaw<google::protobuf::internal::ArenaStringPtr>(this,message,field);
  return pAVar4->ptr_;
}

Assistant:

const std::string& Reflection::GetStringReference(const Message& message,
                                                  const FieldDescriptor* field,
                                                  std::string* scratch) const {
  USAGE_CHECK_ALL(GetStringReference, SINGULAR, STRING);
  if (field->is_extension()) {
    return GetExtensionSet(message).GetString(field->number(),
                                              field->default_value_string());
  } else {
    switch (field->options().ctype()) {
      default:  // TODO(kenton):  Support other string reps.
      case FieldOptions::STRING: {
        if (IsInlined(field)) {
          return GetField<InlinedStringField>(message, field).GetNoArena();
        }

        return GetField<ArenaStringPtr>(message, field).Get();
      }
    }
  }
}